

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O2

iterator __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::getItFor
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *bucket)

{
  size_t sVar1;
  iterator iVar2;
  
  iVar2._M_node = (this->buckets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sVar1 = bucket->id;
  while( true ) {
    if ((_Rb_tree_header *)iVar2._M_node == &(this->buckets)._M_t._M_impl.super__Rb_tree_header) {
      abort();
    }
    if (**(size_t **)(iVar2._M_node + 1) == sVar1) break;
    iVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar2._M_node);
  }
  return (iterator)iVar2._M_node;
}

Assistant:

UniqueBucketSet::iterator getItFor(const Bucket &bucket) const {
        for (auto it = buckets.begin(); it != buckets.end(); ++it) {
            if (**it == bucket)
                return it;
        }
        assert(0 && "unreachable");
        abort();
    }